

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *
capnp::_::anon_unknown_0::getCallSequence
          (RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
           *__return_storage_ptr__,Client *client,uint expected)

{
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Maybe<capnp::MessageSize> local_70;
  undefined1 local_58 [8];
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  req;
  uint expected_local;
  Client *client_local;
  
  req.hook.ptr._4_4_ = expected;
  kj::Maybe<capnp::MessageSize>::Maybe();
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_58,client,&local_70);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_70);
  capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams::Builder::setExpected
            ((Builder *)local_58,req.hook.ptr._4_4_);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)__return_storage_ptr__,(int)local_58,__buf,in_RCX,in_R8D);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_58);
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<test::TestCallOrder::GetCallSequenceResults> getCallSequence(
    test::TestCallOrder::Client& client, uint expected) {
  auto req = client.getCallSequenceRequest();
  req.setExpected(expected);
  return req.send();
}